

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_double_*> *fmt)

{
  double *pdVar1;
  
  std::operator<<(str,"{ ");
  for (pdVar1 = fmt->begin; pdVar1 != fmt->end; pdVar1 = pdVar1 + 1) {
    if (pdVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::_M_insert<double>(*pdVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}